

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_err_t linear_hash_init(ion_dictionary_id_t id,ion_dictionary_size_t dictionary_size,
                          ion_key_type_t key_type,ion_key_size_t key_size,
                          ion_value_size_t value_size,int initial_size,int split_threshold,
                          int records_per_bucket,linear_hash_table_t *linear_hash)

{
  ion_err_t iVar1;
  char cVar2;
  ion_byte_t *piVar3;
  array_list_t *array_list;
  FILE *pFVar4;
  int idx;
  char state_filename [12];
  char data_filename [12];
  
  (linear_hash->super).id = id;
  linear_hash->dictionary_size = dictionary_size;
  (linear_hash->super).key_type = key_type;
  (linear_hash->super).record.key_size = key_size;
  (linear_hash->super).record.value_size = value_size;
  linear_hash->initial_size = initial_size;
  linear_hash->num_buckets = initial_size;
  linear_hash->num_records = 0;
  linear_hash->next_split = 0;
  linear_hash->split_threshold = split_threshold;
  linear_hash->records_per_bucket = records_per_bucket;
  linear_hash->record_total_size = (long)(value_size + key_size) + 1;
  piVar3 = (ion_byte_t *)malloc(0x80);
  linear_hash->cache = piVar3;
  dictionary_get_filename(id,"lhd",data_filename);
  dictionary_get_filename((linear_hash->super).id,"lhs",state_filename);
  array_list = (array_list_t *)malloc(0x10);
  if (array_list == (array_list_t *)0x0) {
    linear_hash_close(linear_hash);
    return '\x06';
  }
  iVar1 = array_list_init(5,array_list);
  if (iVar1 == '\0') {
    linear_hash->bucket_map = array_list;
    pFVar4 = fopen(data_filename,"r+b");
    linear_hash->database = (FILE *)pFVar4;
    if (pFVar4 != (FILE *)0x0) {
LAB_00111e4a:
      pFVar4 = fopen(state_filename,"r+b");
      linear_hash->state = (FILE *)pFVar4;
      if (pFVar4 == (FILE *)0x0) {
        pFVar4 = fopen(state_filename,"w+b");
        linear_hash->state = (FILE *)pFVar4;
        if (pFVar4 == (FILE *)0x0) {
          return '\t';
        }
        cVar2 = linear_hash_write_state(linear_hash);
      }
      else {
        cVar2 = linear_hash_read_state(linear_hash);
      }
      if (cVar2 == '\0') {
        iVar1 = linear_hash_write_state(linear_hash);
        return iVar1;
      }
      return cVar2;
    }
    pFVar4 = fopen(data_filename,"w+b");
    linear_hash->database = (FILE *)pFVar4;
    if (pFVar4 == (FILE *)0x0) {
      return '\t';
    }
    idx = 0;
    do {
      if (linear_hash->initial_size <= idx) goto LAB_00111e4a;
      iVar1 = write_new_bucket(idx,linear_hash);
      idx = idx + 1;
    } while (iVar1 == '\0');
  }
  linear_hash_close(linear_hash);
  return iVar1;
}

Assistant:

ion_err_t
linear_hash_init(
	ion_dictionary_id_t		id,
	ion_dictionary_size_t	dictionary_size,
	ion_key_type_t			key_type,
	ion_key_size_t			key_size,
	ion_value_size_t		value_size,
	int						initial_size,
	int						split_threshold,
	int						records_per_bucket,
	linear_hash_table_t		*linear_hash
) {
	/* err */
	ion_err_t err;

	/* parameter not used */
	linear_hash->super.id					= id;
	linear_hash->dictionary_size			= dictionary_size;
	linear_hash->super.key_type				= key_type;
	linear_hash->super.record.key_size		= key_size;
	linear_hash->super.record.value_size	= value_size;

	/* initialize linear_hash fields */
	linear_hash->initial_size				= initial_size;
	linear_hash->num_buckets				= initial_size;
	linear_hash->num_records				= 0;
	linear_hash->next_split					= 0;
	linear_hash->split_threshold			= split_threshold;
	linear_hash->records_per_bucket			= records_per_bucket;
	linear_hash->record_total_size			= key_size + value_size + sizeof(ion_byte_t);
	linear_hash->cache						= malloc(128);

	char data_filename[ION_MAX_FILENAME_LENGTH];

	dictionary_get_filename(linear_hash->super.id, "lhd", data_filename);

	char state_filename[ION_MAX_FILENAME_LENGTH];

	dictionary_get_filename(linear_hash->super.id, "lhs", state_filename);

	/* mapping of buckets to file offsets */
	array_list_t *bucket_map;

	bucket_map = malloc(sizeof(array_list_t));

	if (NULL == bucket_map) {
		/* clean up resources before returning if out of memory */
		linear_hash_close(linear_hash);
		return err_out_of_memory;
	}

	err = array_list_init(5, bucket_map);

	if (err != err_ok) {
		/* clean up resources before returning if out of memory */
		linear_hash_close(linear_hash);
		return err;
	}

	linear_hash->bucket_map = bucket_map;
	linear_hash->database	= fopen(data_filename, "r+b");

	if (NULL == linear_hash->database) {
		linear_hash->database = fopen(data_filename, "w+b");

		if (NULL == linear_hash->database) {
			return err_file_open_error;
		}

		int i;

		for (i = 0; i < linear_hash->initial_size; i++) {
			err = write_new_bucket(i, linear_hash);

			if (err != err_ok) {
				linear_hash_close(linear_hash);
				return err;
			}
		}
	}

	linear_hash->state = fopen(state_filename, "r+b");

	if (NULL == linear_hash->state) {
		linear_hash->state = fopen(state_filename, "w+b");

		if (NULL == linear_hash->state) {
			return err_file_open_error;
		}

		err = linear_hash_write_state(linear_hash);

		if (err != err_ok) {
			return err;
		}
	}
	else {
		err = linear_hash_read_state(linear_hash);

		if (err != err_ok) {
			return err;
		}
	}

	err = linear_hash_write_state(linear_hash);

	if (err != err_ok) {
		return err;
	}

	/* return pointer to the linear_hash that is sitting in memory */
	return err_ok;
}